

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O1

void __thiscall tvm::runtime::TVMRetValue::Clear(TVMRetValue *this)

{
  int *piVar1;
  int type_code;
  long lVar2;
  code *pcVar3;
  ExtTypeVTable *pEVar4;
  ulong uVar5;
  NodePtr<tvm::Node> *this_00;
  
  switch((this->super_TVMPODValue_).type_code_) {
  case 4:
    goto switchD_00109db6_caseD_4;
  case 8:
    this_00 = (NodePtr<tvm::Node> *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (NodePtr<tvm::Node> *)0x0) {
      NodePtr<tvm::Node>::~NodePtr(this_00);
      uVar5 = 8;
LAB_00109e4a:
      operator_delete(this_00,uVar5);
    }
    break;
  case 9:
    this_00 = (NodePtr<tvm::Node> *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (NodePtr<tvm::Node> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[1].data_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00[1].data_);
      }
      uVar5 = 0x10;
      goto LAB_00109e4a;
    }
    break;
  case 10:
    this_00 = (NodePtr<tvm::Node> *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (NodePtr<tvm::Node> *)0x0) {
      if (this_00[2].data_ != (NodeBase *)0x0) {
        (*(code *)this_00[2].data_)(this_00,this_00,3);
      }
LAB_00109e45:
      uVar5 = 0x20;
      goto LAB_00109e4a;
    }
    break;
  case 0xb:
    this_00 = (NodePtr<tvm::Node> *)(this->super_TVMPODValue_).value_.v_handle;
    if (this_00 != (NodePtr<tvm::Node> *)0x0) {
      if (this_00->data_ != (NodeBase *)(this_00 + 2)) {
        operator_delete(this_00->data_,*(long *)(this_00 + 2) + 1);
      }
      goto LAB_00109e45;
    }
    break;
  case 0xd:
    lVar2 = (this->super_TVMPODValue_).value_.v_int64;
    LOCK();
    piVar1 = (int *)(lVar2 + 0x44);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (pcVar3 = *(code **)(lVar2 + 0x38), pcVar3 != (code *)0x0)) {
      (*pcVar3)();
    }
  }
  type_code = (this->super_TVMPODValue_).type_code_;
  if (0xf < type_code) {
    pEVar4 = ExtTypeVTable::Get(type_code);
    (*pEVar4->destroy)((this->super_TVMPODValue_).value_.v_handle);
  }
  (this->super_TVMPODValue_).type_code_ = 4;
switchD_00109db6_caseD_4:
  return;
}

Assistant:

void Clear() {
    if (type_code_ == kNull)
      return;
    switch (type_code_) {
    case kStr:
      delete ptr<std::string>();
      break;
    case kFuncHandle:
      delete ptr<PackedFunc>();
      break;
    case kModuleHandle:
      delete ptr<Module>();
      break;
    case kNodeHandle:
      delete ptr<NodePtr<Node>>();
      break;
    case kNDArrayContainer: {
      static_cast<NDArray::Container *>(value_.v_handle)->DecRef();
      break;
    }
    }
    if (type_code_ > kExtBegin) {
#if TVM_RUNTIME_HEADER_ONLY
      LOG(FATAL) << "Header only mode do not support ext type";
#else
      (*(ExtTypeVTable::Get(type_code_)->destroy))(value_.v_handle);
#endif
    }
    type_code_ = kNull;
  }